

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyGraph.cpp
# Opt level: O0

void pgi::randomize_nodes_with_steps_remaining(uint steps,PolicyGraph *g,PRNG *rng)

{
  iterator_facade_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_unsigned_long,_boost::iterators::bidirectional_traversal_tag,_unsigned_long,_long,_false,_false>
  *this;
  reference qp;
  filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
  __end1;
  filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
  __begin1;
  iterator_range<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> avoid_same_policy;
  iterator_range_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::incrementable_traversal_tag>
  *in_stack_fffffffffffffe78;
  pair<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  iterator_facade_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_unsigned_long,_boost::iterators::bidirectional_traversal_tag,_unsigned_long,_long,_false,_false>
  *in_stack_fffffffffffffe90;
  vertex_t in_stack_fffffffffffffe98;
  PolicyGraph *in_stack_fffffffffffffea0;
  PolicyGraph *in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffefc;
  undefined1 local_98 [96];
  undefined1 *local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2ce42b);
  vertices_with_steps_remaining(in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
  boost::
  make_iterator_range<std::pair<boost::iterators::filter_iterator<boost::function<bool(unsigned_long)>,boost::range_detail::integer_iterator<unsigned_long>>,boost::iterators::filter_iterator<boost::function<bool(unsigned_long)>,boost::range_detail::integer_iterator<unsigned_long>>>>
            ((pair<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
              *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  std::
  pair<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  ::~pair(in_stack_fffffffffffffe80);
  local_38 = local_98;
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin(in_stack_fffffffffffffe78);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::incrementable_traversal_tag>
  ::end(in_stack_fffffffffffffe78);
  while( true ) {
    in_stack_fffffffffffffe8f =
         boost::iterators::operator!=
                   ((iterator_facade<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_unsigned_long,_boost::iterators::bidirectional_traversal_tag,_unsigned_long,_long>
                     *)in_stack_fffffffffffffe90,
                    (iterator_facade<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_unsigned_long,_boost::iterators::bidirectional_traversal_tag,_unsigned_long,_long>
                     *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    if (!(bool)in_stack_fffffffffffffe8f) break;
    this = (iterator_facade_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_unsigned_long,_boost::iterators::bidirectional_traversal_tag,_unsigned_long,_long,_false,_false>
            *)boost::iterators::detail::
              iterator_facade_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_unsigned_long,_boost::iterators::bidirectional_traversal_tag,_unsigned_long,_long,_false,_false>
              ::operator*((iterator_facade_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_unsigned_long,_boost::iterators::bidirectional_traversal_tag,_unsigned_long,_long,_false,_false>
                           *)0x2ce58b);
    in_stack_fffffffffffffe90 = this;
    randomize_local_policy
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(PRNG *)this,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe90,
               (value_type_conflict *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88))
    ;
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_unsigned_long,_boost::iterators::bidirectional_traversal_tag,_unsigned_long,_long,_false,_false>
    ::operator++(this);
  }
  boost::iterators::
  filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
  ::~filter_iterator((filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
                      *)0x2ce4d4);
  boost::iterators::
  filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
  ::~filter_iterator((filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
                      *)0x2ce4de);
  boost::
  iterator_range<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  ::~iterator_range((iterator_range<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
                     *)0x2ce4eb);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

void randomize_nodes_with_steps_remaining(unsigned int steps, PolicyGraph& g,
                                          PRNG& rng) {
  std::vector<vertex_t> avoid_same_policy;
  for (auto qp :
       boost::make_iterator_range(vertices_with_steps_remaining(steps, g))) {
    randomize_local_policy(g, qp, rng, avoid_same_policy);
    avoid_same_policy.push_back(qp);
  }
}